

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_ecdsa_verify(mbedtls_ecp_keypair *ecp,uint8_t *hash,size_t hash_length,uint8_t *signature,
                size_t signature_length)

{
  ulong buflen;
  size_t curve_bytes;
  mbedtls_mpi s;
  mbedtls_mpi r;
  int ret;
  size_t signature_length_local;
  uint8_t *signature_local;
  size_t hash_length_local;
  uint8_t *hash_local;
  mbedtls_ecp_keypair *ecp_local;
  
  buflen = (ecp->grp).pbits + 7 >> 3;
  mbedtls_mpi_init((mbedtls_mpi *)&s.p);
  mbedtls_mpi_init((mbedtls_mpi *)&curve_bytes);
  if (signature_length == buflen * 2) {
    r.p._4_4_ = mbedtls_mpi_read_binary((mbedtls_mpi *)&s.p,signature,buflen);
    if ((r.p._4_4_ == 0) &&
       (r.p._4_4_ = mbedtls_mpi_read_binary((mbedtls_mpi *)&curve_bytes,signature + buflen,buflen),
       r.p._4_4_ == 0)) {
      r.p._4_4_ = mbedtls_ecdsa_verify
                            (&ecp->grp,hash,hash_length,&ecp->Q,(mbedtls_mpi *)&s.p,
                             (mbedtls_mpi *)&curve_bytes);
    }
    mbedtls_mpi_free((mbedtls_mpi *)&s.p);
    mbedtls_mpi_free((mbedtls_mpi *)&curve_bytes);
    ecp_local._4_4_ = mbedtls_to_psa_error(r.p._4_4_);
  }
  else {
    ecp_local._4_4_ = -0x95;
  }
  return ecp_local._4_4_;
}

Assistant:

static psa_status_t psa_ecdsa_verify( mbedtls_ecp_keypair *ecp,
                                      const uint8_t *hash,
                                      size_t hash_length,
                                      const uint8_t *signature,
                                      size_t signature_length )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi r, s;
    size_t curve_bytes = PSA_BITS_TO_BYTES( ecp->grp.pbits );
    mbedtls_mpi_init( &r );
    mbedtls_mpi_init( &s );

    if( signature_length != 2 * curve_bytes )
        return( PSA_ERROR_INVALID_SIGNATURE );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &r,
                                              signature,
                                              curve_bytes ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_binary( &s,
                                              signature + curve_bytes,
                                              curve_bytes ) );

    ret = mbedtls_ecdsa_verify( &ecp->grp, hash, hash_length,
                                &ecp->Q, &r, &s );

cleanup:
    mbedtls_mpi_free( &r );
    mbedtls_mpi_free( &s );
    return( mbedtls_to_psa_error( ret ) );
}